

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::VulkanSyncObjectManager
          (VulkanSyncObjectManager *this,VulkanLogicalDevice *LogicalDevice)

{
  (this->super_enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>)._M_weak_this.
  super___weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>)._M_weak_this.
  super___weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_LogicalDevice = LogicalDevice;
  (this->m_SemaphorePoolGuard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_SemaphorePoolGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_SemaphorePoolGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_SemaphorePoolGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_SemaphorePoolGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_SemaphorePool).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SemaphorePool).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SemaphorePool).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_FencePoolGuard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_FencePoolGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_FencePoolGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_FencePoolGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_FencePoolGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::reserve
            (&this->m_SemaphorePool,0x40);
  std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::reserve(&this->m_FencePool,0x20);
  return;
}

Assistant:

VulkanSyncObjectManager::VulkanSyncObjectManager(VulkanLogicalDevice& LogicalDevice) :
    m_LogicalDevice{LogicalDevice}
{
    m_SemaphorePool.reserve(64);
    m_FencePool.reserve(32);
}